

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::MulDivOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::MulDivOp>(RecursiveDescentParser *this)

{
  char *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::MulDivOp> sVar2;
  undefined1 local_19;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::MulDivOp,std::allocator<MyCompiler::MulDivOp>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(MulDivOp **)this,
             (allocator<MyCompiler::MulDivOp> *)&local_19);
  pcVar1 = "/";
  if (in_RSI->sym == TIMES) {
    pcVar1 = "*";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(this->stream + 0x28),0,*(char **)(this->stream + 0x30),(ulong)pcVar1);
  nextSym(in_RSI);
  sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::MulDivOp>)
         sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::MulDivOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<MulDivOp>();

    switch (sym)
    {
        case SymbolType::TIMES:
            pResult->value = "*";
            break;
        default: // case SymbolType::SLASH:
            pResult->value = "/";
    }
    accept(sym);

    return pResult;
}